

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

StructReader * __thiscall
capnp::_::ListReader::getStructElement
          (StructReader *__return_storage_ptr__,ListReader *this,ElementCount index)

{
  StructPointerCount SVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  CapTableReader *pCVar6;
  
  iVar2 = this->nestingLimit;
  if (iVar2 < 1) {
    getStructElement();
  }
  else {
    uVar3 = this->step;
    pbVar5 = this->ptr;
    uVar4 = this->structDataSize;
    SVar1 = this->structPointerCount;
    pCVar6 = this->capTable;
    __return_storage_ptr__->segment = this->segment;
    __return_storage_ptr__->capTable = pCVar6;
    __return_storage_ptr__->data = pbVar5 + ((ulong)uVar3 * (ulong)index >> 3);
    __return_storage_ptr__->pointers =
         (WirePointer *)(pbVar5 + ((ulong)uVar3 * (ulong)index >> 3) + (uVar4 >> 3));
    __return_storage_ptr__->dataSize = uVar4;
    __return_storage_ptr__->pointerCount = SVar1;
    __return_storage_ptr__->nestingLimit = iVar2 + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

StructReader ListReader::getStructElement(ElementCount index) const {
  KJ_REQUIRE(nestingLimit > 0,
             "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.") {
    return StructReader();
  }

  auto indexBit = upgradeBound<uint64_t>(index) * step;
  const byte* structData = ptr + indexBit / BITS_PER_BYTE;
  const WirePointer* structPointers =
      reinterpret_cast<const WirePointer*>(structData + structDataSize / BITS_PER_BYTE);

  KJ_DASSERT(indexBit % BITS_PER_BYTE == ZERO * BITS);
  return StructReader(
      segment, capTable, structData, structPointers,
      structDataSize, structPointerCount,
      nestingLimit - 1);
}